

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitFunctionDefinition(SyntaxDumper *this,FunctionDefinitionSyntax *node)

{
  SpecifierListSyntax *pSVar1;
  _func_int *p_Var2;
  ExtKR_ParameterDeclarationListSyntax *pEVar3;
  SpecifierListSyntax **ppSVar4;
  ExtKR_ParameterDeclarationListSyntax **ppEVar5;
  
  traverseDeclaration(this,&node->super_DeclarationSyntax);
  ppSVar4 = &node->specs_;
  while( true ) {
    pSVar1 = *ppSVar4;
    p_Var2 = (this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e];
    if (pSVar1 == (SpecifierListSyntax *)0x0) break;
    (*p_Var2)(this,(pSVar1->
                   super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   ).
                   super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   .value);
    ppSVar4 = &(pSVar1->
               super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               ).
               super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               .next;
  }
  (*p_Var2)(this,node->decltor_);
  ppEVar5 = &node->extKR_params_;
  while( true ) {
    pEVar3 = *ppEVar5;
    p_Var2 = (this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e];
    if (pEVar3 == (ExtKR_ParameterDeclarationListSyntax *)0x0) break;
    (*p_Var2)(this,(pEVar3->
                   super_CoreSyntaxNodeList<psy::C::ExtKR_ParameterDeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::ExtKR_ParameterDeclarationSyntax_*>_>
                   ).
                   super_List<psy::C::ExtKR_ParameterDeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::ExtKR_ParameterDeclarationSyntax_*>_>
                   .value);
    ppEVar5 = &(pEVar3->
               super_CoreSyntaxNodeList<psy::C::ExtKR_ParameterDeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::ExtKR_ParameterDeclarationSyntax_*>_>
               ).
               super_List<psy::C::ExtKR_ParameterDeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::ExtKR_ParameterDeclarationSyntax_*>_>
               .next;
  }
  (*p_Var2)(this,node->body_);
  return Skip;
}

Assistant:

virtual Action visitFunctionDefinition(const FunctionDefinitionSyntax* node) override
    {
        traverseDeclaration(node);
        for (auto iter = node->specifiers(); iter; iter = iter->next)
            nonterminal(iter->value);
        nonterminal(node->declarator());
        for (auto iter = node->extKR_params(); iter; iter = iter->next)
            nonterminal(iter->value);
        nonterminal(node->body());
        return Action::Skip;
    }